

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O2

void __thiscall
chrono::robosimian::RS_Limb::RS_Limb
          (RS_Limb *this,string *name,LimbID id,LinkData *data,
          shared_ptr<chrono::ChMaterialSurface> *wheel_mat,
          shared_ptr<chrono::ChMaterialSurface> *link_mat,ChSystem *system)

{
  double dVar1;
  ChFrame *pCVar2;
  pointer pCVar3;
  float fVar4;
  int iVar5;
  pointer pCVar6;
  long lVar7;
  LinkData *__rhs;
  shared_ptr<chrono::robosimian::RS_Part> link;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  __shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2> *local_138;
  shared_ptr<chrono::ChMaterialSurface> *local_130;
  shared_ptr<chrono::ChMaterialSurface> *local_128;
  ulong local_120;
  LinkData *local_118;
  long local_110;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_108 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double local_d8;
  double dStack_d0;
  double local_c8;
  ChFrame<double> local_b8;
  
  local_130 = wheel_mat;
  local_128 = link_mat;
  local_118 = data;
  std::__cxx11::string::string((string *)this,(string *)name);
  (this->m_links)._M_h._M_buckets = &(this->m_links)._M_h._M_single_bucket;
  (this->m_links)._M_h._M_bucket_count = 1;
  (this->m_links)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_links)._M_h._M_element_count = 0;
  (this->m_links)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_links)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_links)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_joints)._M_h._M_buckets = &(this->m_joints)._M_h._M_single_bucket;
  (this->m_joints)._M_h._M_bucket_count = 1;
  (this->m_joints)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_joints)._M_h._M_element_count = 0;
  (this->m_joints)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_joints)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_joints)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_motors)._M_h._M_buckets = &(this->m_motors)._M_h._M_single_bucket;
  (this->m_motors)._M_h._M_bucket_count = 1;
  (this->m_motors)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_motors)._M_h._M_element_count = 0;
  local_120 = (ulong)(id * 4 + 4);
  (this->m_motors)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_138 = &(this->m_wheel).
               super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>;
  *(undefined1 (*) [32])&(this->m_motors)._M_h._M_rehash_policy._M_next_resize = ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])
   ((long)&(this->m_wheel).
           super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1) =
       ZEXT432(0) << 0x40;
  this->m_collide_wheel = true;
  for (lVar7 = 0; lVar7 != 0xb; lVar7 = lVar7 + 1) {
    __rhs = local_118 + lVar7;
    iVar5 = std::__cxx11::string::compare((char *)__rhs);
    link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (iVar5 == 0) {
      std::operator+(&local_158,&this->m_name,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8,
                     &local_158,&__rhs->name);
      std::
      make_shared<chrono::robosimian::RS_Part,std::__cxx11::string,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::ChSystem*&>
                (&local_178,(shared_ptr<chrono::ChMaterialSurface> *)&local_b8,
                 (ChSystem **)local_130);
    }
    else {
      std::operator+(&local_158,&this->m_name,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8,
                     &local_158,&__rhs->name);
      std::
      make_shared<chrono::robosimian::RS_Part,std::__cxx11::string,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::ChSystem*&>
                (&local_178,(shared_ptr<chrono::ChMaterialSurface> *)&local_b8,
                 (ChSystem **)local_128);
    }
    std::__shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2> *)&local_178);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_178._M_string_length);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_158);
    local_178._M_dataplus._M_p = (pointer)(__rhs->link).m_com.m_data[0];
    local_178._M_string_length = (size_type)(__rhs->link).m_com.m_data[1];
    dVar1 = (__rhs->link).m_mass;
    local_178.field_2._M_allocated_capacity = (size_type)(__rhs->link).m_com.m_data[2];
    local_d8 = (__rhs->link).m_inertia_xx.m_data[0];
    dStack_d0 = (__rhs->link).m_inertia_xx.m_data[1];
    local_c8 = (__rhs->link).m_inertia_xx.m_data[2];
    local_f8 = (__rhs->link).m_inertia_xy.m_data[0];
    dStack_f0 = (__rhs->link).m_inertia_xy.m_data[1];
    local_e8 = (__rhs->link).m_inertia_xy.m_data[2];
    *(int *)(((link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr + 0x28) = (int)local_120 + (int)lVar7;
    chrono::ChVariablesBodyOwnMass::SetBodyMass(dVar1);
    pCVar2 = (ChFrame *)
             ((link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_158._M_dataplus._M_p = &DAT_3ff0000000000000;
    local_158.field_2._8_8_ = 0;
    local_158._M_string_length = 0;
    local_158.field_2._M_allocated_capacity = 0;
    ChFrame<double>::ChFrame
              (&local_b8,(ChVector<double> *)&local_178,(ChQuaternion<double> *)&local_158);
    chrono::ChBodyAuxRef::SetFrame_COG_to_REF(pCVar2);
    chrono::ChBody::SetInertiaXX
              (((link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->m_body).
               super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    chrono::ChBody::SetInertiaXY
              (((link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->m_body).
               super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::__cxx11::string::_M_assign
              ((string *)
               &(link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->m_mesh_name);
    if (&(__rhs->link).m_offset !=
        &(link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         m_offset) {
      ((link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_offset).m_data[0] = (__rhs->link).m_offset.m_data[0];
      ((link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_offset).m_data[1] = (__rhs->link).m_offset.m_data[1];
      ((link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_offset).m_data[2] = (__rhs->link).m_offset.m_data[2];
    }
    if (&(__rhs->link).m_color !=
        &(link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         m_color) {
      fVar4 = (__rhs->link).m_color.G;
      ((link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_color).R = (__rhs->link).m_color.R;
      ((link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_color).G = fVar4;
      ((link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_color).B = (__rhs->link).m_color.B;
    }
    pCVar3 = (__rhs->link).m_shapes.
             super__Vector_base<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_110 = lVar7;
    for (pCVar6 = (__rhs->link).m_shapes.
                  super__Vector_base<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
                  ._M_impl.super__Vector_impl_data._M_start; lVar7 = local_110, pCVar6 != pCVar3;
        pCVar6 = pCVar6 + 1) {
      local_b8._vptr_ChFrame = (_func_int **)(pCVar6->m_pos).m_data[0];
      local_b8.coord.pos.m_data[0] = (pCVar6->m_pos).m_data[1];
      local_b8.coord.pos.m_data[1] = (pCVar6->m_pos).m_data[2];
      local_b8.coord.pos.m_data[2] = (pCVar6->m_rot).m_data[0];
      local_b8.coord.rot.m_data[0] = (pCVar6->m_rot).m_data[1];
      local_b8.coord.rot.m_data[1] = (pCVar6->m_rot).m_data[2];
      local_b8.coord.rot.m_data[2] = (pCVar6->m_rot).m_data[3];
      local_b8.coord.rot.m_data[3] = pCVar6->m_radius;
      local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           pCVar6->m_length;
      std::
      vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
      ::push_back(&(link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->m_cylinders,(value_type *)&local_b8);
    }
    if (__rhs->include != false) {
      std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<chrono::ChBodyAuxRef,void>
                (local_108,
                 &((link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->m_body).
                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
      chrono::ChSystem::Add(system,local_108);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>
    ::pair<std::shared_ptr<chrono::robosimian::RS_Part>_&,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>
                *)&local_b8,&__rhs->name,&link);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::robosimian::RS_Part>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::robosimian::RS_Part>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<chrono::robosimian::RS_Part>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::robosimian::RS_Part>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::robosimian::RS_Part>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->m_links,&local_b8);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>
             *)&local_b8);
    if (iVar5 == 0) {
      std::__shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>::operator=
                (local_138,
                 &link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&link.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

RS_Limb::RS_Limb(const std::string& name,
                 LimbID id,
                 const LinkData data[],
                 std::shared_ptr<ChMaterialSurface> wheel_mat,
                 std::shared_ptr<ChMaterialSurface> link_mat,
                 ChSystem* system)
    : m_name(name), m_collide_links(false), m_collide_wheel(true) {
    for (int i = 0; i < num_links; i++) {
        bool is_wheel = (data[i].name.compare("link8") == 0);

        std::shared_ptr<RS_Part> link;
        if (is_wheel) {
            link = chrono_types::make_shared<RS_Part>(m_name + "_" + data[i].name, wheel_mat, system);
        } else {
            link = chrono_types::make_shared<RS_Part>(m_name + "_" + data[i].name, link_mat, system);
        }

        double mass = data[i].link.m_mass;
        ChVector<> com = data[i].link.m_com;
        ChVector<> inertia_xx = data[i].link.m_inertia_xx;
        ChVector<> inertia_xy = data[i].link.m_inertia_xy;

        link->m_body->SetIdentifier(4 + 4 * id + i);
        link->m_body->SetMass(mass);
        link->m_body->SetFrame_COG_to_REF(ChFrame<>(com, ChQuaternion<>(1, 0, 0, 0)));
        link->m_body->SetInertiaXX(inertia_xx);
        link->m_body->SetInertiaXY(inertia_xy);

        link->m_mesh_name = data[i].link.m_mesh_name;
        link->m_offset = data[i].link.m_offset;
        link->m_color = data[i].link.m_color;

        for (auto cyl : data[i].link.m_shapes) {
            link->m_cylinders.push_back(cyl);
        }

        if (data[i].include)
            system->Add(link->m_body);

        m_links.insert(std::make_pair(data[i].name, link));
        if (is_wheel)
            m_wheel = link;
    }
}